

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O1

void Imath_2_5::extractEulerZYX<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  Matrix44<float> tmp;
  Vec3<float> local_118;
  Vec3<float> local_108;
  Vec3<float> local_f8;
  Matrix44<float> local_e8;
  Matrix44<float> local_a8;
  undefined1 local_68 [24];
  float local_50;
  float local_4c;
  Vec3<float> local_48;
  undefined8 local_3c;
  float afStack_34 [3];
  
  local_f8.z = mat->x[0][2];
  local_f8.x = *(float *)((long)(mat->x + 0) + 0);
  local_f8.y = *(float *)((long)(mat->x + 0) + 4);
  local_108.z = mat->x[1][2];
  local_108.x = *(float *)((long)(mat->x + 1) + 0);
  local_108.y = *(float *)((long)(mat->x + 1) + 4);
  local_118.z = mat->x[2][2];
  local_118.x = *(float *)((long)(mat->x + 2) + 0);
  local_118.y = *(float *)((long)(mat->x + 2) + 4);
  Vec3<float>::normalize(&local_f8);
  Vec3<float>::normalize(&local_108);
  Vec3<float>::normalize(&local_118);
  local_68._0_4_ = local_f8.x;
  local_68._4_4_ = local_f8.y;
  local_68._8_4_ = local_f8.z;
  local_68._12_4_ = 0.0;
  local_68._16_4_ = local_108.x;
  local_68._20_4_ = local_108.y;
  local_50 = local_108.z;
  local_4c = 0.0;
  local_48.x = local_118.x;
  local_48.y = local_118.y;
  local_48.z = local_118.z;
  local_3c._0_4_ = 0.0;
  local_3c._4_4_ = 0.0;
  afStack_34[0] = 0.0;
  afStack_34[1] = 0.0;
  afStack_34[2] = 1.0;
  local_a8.x[0][2] = atan2f(local_108.x,local_f8.x);
  rot->x = -local_a8.x[0][2];
  local_e8.x[0][2] = 0.0;
  local_e8.x[0][3] = 0.0;
  local_e8.x[1][2] = 0.0;
  local_e8.x[1][3] = 0.0;
  local_e8.x[2][0] = 0.0;
  local_e8.x[2][1] = 0.0;
  local_e8.x[3][0] = 0.0;
  local_e8.x[3][1] = 0.0;
  local_e8.x[0][0] = 1.0;
  local_e8.x[0][1] = 0.0;
  local_e8.x[1][0] = 0.0;
  local_e8.x[1][1] = 1.0;
  local_e8.x[2][2] = 1.0;
  local_e8.x[2][3] = 0.0;
  local_e8.x[3][2] = 0.0;
  local_e8.x[3][3] = 1.0;
  local_a8.x[0][0] = 0.0;
  local_a8.x[0][1] = 0.0;
  Matrix44<float>::rotate<float>(&local_e8,(Vec3<float> *)&local_a8);
  local_a8.x[3][0] = 0.0;
  local_a8.x[3][1] = 0.0;
  local_a8.x[3][2] = 0.0;
  local_a8.x[3][3] = 0.0;
  local_a8.x[2][0] = 0.0;
  local_a8.x[2][1] = 0.0;
  local_a8.x[2][2] = 0.0;
  local_a8.x[2][3] = 0.0;
  local_a8.x[1][0] = 0.0;
  local_a8.x[1][1] = 0.0;
  local_a8.x[1][2] = 0.0;
  local_a8.x[1][3] = 0.0;
  local_a8.x[0][0] = 0.0;
  local_a8.x[0][1] = 0.0;
  local_a8.x[0][2] = 0.0;
  local_a8.x[0][3] = 0.0;
  Matrix44<float>::multiply(&local_e8,(Matrix44<float> *)local_68,&local_a8);
  local_e8.x[0][0] = local_a8.x[0][0];
  local_e8.x[0][1] = local_a8.x[0][1];
  local_e8.x[0][2] = local_a8.x[0][2];
  local_e8.x[0][3] = local_a8.x[0][3];
  local_e8.x[1][0] = local_a8.x[1][0];
  local_e8.x[1][1] = local_a8.x[1][1];
  local_e8.x[1][2] = local_a8.x[1][2];
  local_e8.x[1][3] = local_a8.x[1][3];
  local_e8.x[2][0] = local_a8.x[2][0];
  local_e8.x[2][1] = local_a8.x[2][1];
  uVar1 = local_e8.x[2]._0_8_;
  local_e8.x[2][2] = local_a8.x[2][2];
  local_e8.x[2][3] = local_a8.x[2][3];
  uVar2 = local_e8.x[2]._8_8_;
  local_e8.x[3][0] = local_a8.x[3][0];
  local_e8.x[3][1] = local_a8.x[3][1];
  local_e8.x[3][2] = local_a8.x[3][2];
  local_e8.x[3][3] = local_a8.x[3][3];
  local_e8.x[2][1] = local_a8.x[2][1];
  local_e8.x[2][2] = local_a8.x[2][2];
  fVar3 = local_e8.x[2][2] * local_e8.x[2][2] + local_e8.x[2][1] * local_e8.x[2][1];
  local_e8.x[2]._0_8_ = uVar1;
  local_e8.x[2]._8_8_ = uVar2;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar3 = atan2f(-local_e8.x[2][0],fVar3);
  rot->y = -fVar3;
  fVar3 = atan2f(-local_e8.x[1][2],local_e8.x[1][1]);
  rot->z = -fVar3;
  return;
}

Assistant:

void
extractEulerZYX (const Matrix44<T> &mat, Vec3<T> &rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize();
    j.normalize();
    k.normalize();

    Matrix44<T> M (i[0], i[1], i[2], 0, 
		   j[0], j[1], j[2], 0, 
		   k[0], k[1], k[2], 0, 
		   0,    0,    0,    1);

    //
    // Extract the first angle, rot.x.
    // 

    rot.x = -Math<T>::atan2 (M[1][0], M[0][0]);

    //
    // Remove the x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (0, 0, -rot.x));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy = Math<T>::sqrt (N[2][2]*N[2][2] + N[2][1]*N[2][1]);
    rot.y = -Math<T>::atan2 (-N[2][0], cy);
    rot.z = -Math<T>::atan2 (-N[1][2], N[1][1]);
}